

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void mul128To256(uint64_t a0,uint64_t a1,uint64_t b0,uint64_t b1,uint64_t *z0Ptr,uint64_t *z1Ptr,
                uint64_t *z2Ptr,uint64_t *z3Ptr)

{
  uint64_t local_68;
  uint64_t more2;
  uint64_t more1;
  uint64_t z3;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t *z1Ptr_local;
  uint64_t *z0Ptr_local;
  uint64_t b1_local;
  uint64_t b0_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  z0 = (uint64_t)z1Ptr;
  z1Ptr_local = z0Ptr;
  z0Ptr_local = (uint64_t *)b1;
  b1_local = b0;
  b0_local = a1;
  a1_local = a0;
  mul64To128(a1,b1,&z3,&more1);
  mul64To128(b0_local,b1_local,&z2,&local_68);
  add128(z2,local_68,0,z3,&z2,&z3);
  mul64To128(a1_local,b1_local,&z1,&more2);
  add128(z1,more2,0,z2,&z1,&z2);
  mul64To128(a1_local,(uint64_t)z0Ptr_local,&more2,&local_68);
  add128(more2,local_68,0,z3,&more2,&z3);
  add128(z1,z2,0,more2,&z1,&z2);
  *z3Ptr = more1;
  *z2Ptr = z3;
  *(uint64_t *)z0 = z2;
  *z1Ptr_local = z1;
  return;
}

Assistant:

static inline void
 mul128To256(
     uint64_t a0,
     uint64_t a1,
     uint64_t b0,
     uint64_t b1,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr,
     uint64_t *z3Ptr
 )
{
    uint64_t z0, z1, z2, z3;
    uint64_t more1, more2;

    mul64To128( a1, b1, &z2, &z3 );
    mul64To128( a1, b0, &z1, &more2 );
    add128( z1, more2, 0, z2, &z1, &z2 );
    mul64To128( a0, b0, &z0, &more1 );
    add128( z0, more1, 0, z1, &z0, &z1 );
    mul64To128( a0, b1, &more1, &more2 );
    add128( more1, more2, 0, z2, &more1, &z2 );
    add128( z0, z1, 0, more1, &z0, &z1 );
    *z3Ptr = z3;
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}